

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

char * archive_acl_to_text_l
                 (archive_acl *acl,ssize_t *text_len,wchar_t flags,archive_string_conv *sc)

{
  undefined4 uVar1;
  wchar_t want_type;
  wchar_t wVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  archive_acl_entry *paVar7;
  char *local_70;
  int local_68;
  undefined4 local_64;
  char *local_60;
  char *name;
  size_t len;
  archive_string_conv *local_48;
  size_t *local_40;
  size_t local_38;
  
  want_type = archive_acl_text_want_type(acl,flags);
  if (want_type != L'\0') {
    if (want_type == L'̀') {
      flags = flags | 2;
    }
    local_38 = archive_acl_text_len(acl,want_type,flags,L'\0',(archive *)0x0,sc);
    if (local_38 == 0) {
      return (char *)0x0;
    }
    uVar1 = 0x2c;
    if ((flags & 8U) == 0) {
      uVar1 = 10;
    }
    local_70 = (char *)malloc(local_38);
    if (local_70 == (char *)0x0) {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) {
        pcVar4 = "No memory";
LAB_00577086:
        __archive_errx(1,pcVar4);
      }
    }
    else {
      iVar5 = 0;
      local_60 = local_70;
      local_48 = sc;
      local_40 = (size_t *)text_len;
      if (((uint)want_type >> 8 & 1) != 0) {
        append_entry(&local_70,(char *)0x0,L'Ā',L'✒',flags,(char *)0x0,acl->mode & 0x1c0,
                     L'\xffffffff');
        *local_70 = (char)uVar1;
        local_70 = local_70 + 1;
        append_entry(&local_70,(char *)0x0,L'Ā',L'✔',flags,(char *)0x0,acl->mode & 0x38,
                     L'\xffffffff');
        *local_70 = (char)uVar1;
        local_70 = local_70 + 1;
        append_entry(&local_70,(char *)0x0,L'Ā',L'✖',flags,(char *)0x0,acl->mode & 7,
                     L'\xffffffff');
        iVar5 = 3;
      }
      paVar7 = (archive_acl_entry *)&acl->acl_head;
      local_64 = uVar1;
      while( true ) {
        pcVar4 = local_60;
        do {
          paVar7 = paVar7->next;
          if (paVar7 == (archive_acl_entry *)0x0) {
            *local_70 = '\0';
            len = strlen(local_60);
            if ((long)len < (long)local_38) {
              if (local_40 == (size_t *)0x0) {
                return pcVar4;
              }
              *local_40 = len;
              return pcVar4;
            }
            pcVar4 = "Buffer overrun";
            goto LAB_00577086;
          }
          wVar2 = paVar7->type;
        } while (((wVar2 & want_type) == 0) ||
                (((wVar2 == L'Ā' && (uVar6 = paVar7->tag + L'\xffffd8ee', uVar6 < 5)) &&
                 ((0x15U >> (uVar6 & 0x1f) & 1) != 0))));
        pcVar4 = "default:";
        if (wVar2 != L'Ȁ') {
          pcVar4 = (char *)0x0;
        }
        if ((flags & 2U) == 0) {
          pcVar4 = (char *)0x0;
        }
        local_68 = iVar5;
        wVar2 = archive_mstring_get_mbs_l((archive *)0x0,&paVar7->name,&name,&len,local_48);
        if (wVar2 != L'\0') break;
        if (local_68 != 0) {
          *local_70 = (char)local_64;
          local_70 = local_70 + 1;
        }
        wVar2 = L'\xffffffff';
        if ((flags & 1U) != 0 || name == (char *)0x0) {
          wVar2 = paVar7->id;
        }
        append_entry(&local_70,pcVar4,paVar7->type,paVar7->tag,flags,name,paVar7->permset,wVar2);
        iVar5 = local_68 + 1;
      }
      free(local_60);
    }
  }
  return (char *)0x0;
}

Assistant:

char *
archive_acl_to_text_l(struct archive_acl *acl, ssize_t *text_len, int flags,
    struct archive_string_conv *sc)
{
	int count;
	ssize_t length;
	size_t len;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	int id, r, want_type;
	char *p, *s;

	want_type = archive_acl_text_want_type(acl, flags);

	/* Both NFSv4 and POSIX.1 types found */
	if (want_type == 0)
		return (NULL);

	if (want_type == ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)
		flags |= ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT;

	length = archive_acl_text_len(acl, want_type, flags, 0, NULL, sc);

	if (length == 0)
		return (NULL);

	if (flags & ARCHIVE_ENTRY_ACL_STYLE_SEPARATOR_COMMA)
		separator = ',';
	else
		separator = '\n';

	/* Now, allocate the string and actually populate it. */
	p = s = (char *)malloc(length * sizeof(char));
	if (p == NULL) {
		if (errno == ENOMEM)
			__archive_errx(1, "No memory");
		return (NULL);
	}
	count = 0;

	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_USER_OBJ, flags, NULL,
		    acl->mode & 0700, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_GROUP_OBJ, flags, NULL,
		    acl->mode & 0070, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_OTHER, flags, NULL,
		    acl->mode & 0007, -1);
		count += 3;
	}

	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		if (ap->type == ARCHIVE_ENTRY_ACL_TYPE_DEFAULT &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) != 0)
			prefix = "default:";
		else
			prefix = NULL;
		r = archive_mstring_get_mbs_l(
		    NULL, &ap->name, &name, &len, sc);
		if (r != 0) {
			free(s);
			return (NULL);
		}
		if (count > 0)
			*p++ = separator;
		if (name == NULL ||
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)) {
			id = ap->id;
		} else {
			id = -1;
		}
		append_entry(&p, prefix, ap->type, ap->tag, flags, name,
		    ap->permset, id);
		count++;
	}

	/* Add terminating character */
	*p++ = '\0';

	len = strlen(s);

	if ((ssize_t)len > (length - 1))
		__archive_errx(1, "Buffer overrun");

	if (text_len != NULL)
		*text_len = len;

	return (s);
}